

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::EnableStmtVisitor::visit(EnableStmtVisitor *this,AssignStmt *stmt)

{
  Var *in_RDX;
  undefined1 local_40 [8];
  string str_value;
  AssignStmt *stmt_local;
  
  if (stmt->assign_type_ == Blocking) {
    str_value.field_2._8_8_ = stmt;
    get_ssa_enable_condition_abi_cxx11_((string *)local_40,(EnableStmtVisitor *)stmt->left_,in_RDX);
    if (str_value._M_dataplus._M_p != (pointer)0x0) {
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::AssignStmt*&,std::__cxx11::string&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->values,(undefined1 *)((long)&str_value.field_2 + 8),local_40);
    }
    if (local_40 != (undefined1  [8])&str_value._M_string_length) {
      operator_delete((void *)local_40,str_value._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        // we're only interested in top level blocking assignment
        if (stmt->assign_type() != AssignmentType::Blocking) return;
        auto* left = stmt->left();
        auto str_value = get_ssa_enable_condition(left);
        if (!str_value.empty()) {
            values.emplace(stmt, str_value);
        }
    }